

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mondata.c
# Opt level: O1

boolean resists_blnd(monst *mon)

{
  permonst *ppVar1;
  boolean bVar2;
  ulong uVar3;
  obj **ppoVar4;
  obj *poVar5;
  
  ppVar1 = mon->data;
  if (mon == &youmonst) {
    if ((u.uprops[0x1e].intrinsic != 0) ||
       (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
        (((youmonst.data)->mflags1 & 0x1000) != 0)))) {
      if (ublindf == (obj *)0x0) {
        return '\x01';
      }
      if (ublindf->oartifact != '\x1d') {
        return '\x01';
      }
    }
    if (u.usleep != 0) {
      return '\x01';
    }
  }
  else {
    if (mon->mblinded != '\0') {
      return '\x01';
    }
    if ((*(uint *)&mon->field_0x60 >> 0x11 & 1) == 0) {
      return '\x01';
    }
    if ((*(uint *)&mon->field_0x60 & 0x80000) != 0 || (ppVar1->mflags1 & 0x1000) != 0) {
      return '\x01';
    }
  }
  uVar3 = 0xc;
  do {
    if ((*(char *)((long)ppVar1->mattk + (uVar3 - 0xb)) == '\v') &&
       (*(char *)((long)(ppVar1->mattk + -3) + uVar3) == '\r')) {
      return '\x01';
    }
    uVar3 = uVar3 + 4;
  } while (uVar3 < 0x24);
  uVar3 = 0xc;
  do {
    if ((*(char *)((long)ppVar1->mattk + (uVar3 - 0xb)) == '\v') &&
       (*(char *)((long)(ppVar1->mattk + -3) + uVar3) == '\x0f')) {
      return '\x01';
    }
    uVar3 = uVar3 + 4;
  } while (uVar3 < 0x24);
  if (mon == &youmonst) {
    ppoVar4 = &uwep;
  }
  else {
    ppoVar4 = &mon->mw;
  }
  poVar5 = *ppoVar4;
  if (((poVar5 != (obj *)0x0) && (poVar5->oartifact != '\0')) &&
     (bVar2 = defends(0xb,poVar5), bVar2 != '\0')) {
    return '\x01';
  }
  if (mon == &youmonst) {
    ppoVar4 = &invent;
  }
  else {
    ppoVar4 = &mon->minvent;
  }
  poVar5 = *ppoVar4;
  if (poVar5 != (obj *)0x0) {
    while ((poVar5->oartifact == '\0' || (bVar2 = protects(0xb,poVar5), bVar2 == '\0'))) {
      poVar5 = poVar5->nobj;
      if (poVar5 == (obj *)0x0) {
        return '\0';
      }
    }
    return '\x01';
  }
  return '\0';
}

Assistant:

boolean resists_blnd(struct monst *mon)
{
	const struct permonst *ptr = mon->data;
	boolean is_you = (mon == &youmonst);
	struct obj *o;

	if (is_you ? (Blind || u.usleep) :
		(mon->mblinded || !mon->mcansee || !haseyes(ptr) ||
		    /* BUG: temporary sleep sets mfrozen, but since
			    paralysis does too, we can't check it */
		    mon->msleeping))
	    return TRUE;
	/* yellow light, Archon; !dust vortex, !cobra, !raven */
	if (dmgtype_fromattack(ptr, AD_BLND, AT_EXPL) ||
		dmgtype_fromattack(ptr, AD_BLND, AT_GAZE))
	    return TRUE;
	o = is_you ? uwep : MON_WEP(mon);
	if (o && o->oartifact && defends(AD_BLND, o))
	    return TRUE;
	o = is_you ? invent : mon->minvent;
	for ( ; o; o = o->nobj)
	    if (o->oartifact && protects(AD_BLND, o))
		return TRUE;
	return FALSE;
}